

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsRandomness(sqlite3_vfs *pVfs,int nByte,char *zBufOut)

{
  char *zBufOut_local;
  int nByte_local;
  sqlite3_vfs *pVfs_local;
  
  if (sqlite3Config.iPrngSeed == 0) {
    pVfs_local._4_4_ = (*pVfs->xRandomness)(pVfs,nByte,zBufOut);
  }
  else {
    memset(zBufOut,0,(long)nByte);
    zBufOut_local._4_4_ = nByte;
    if (4 < nByte) {
      zBufOut_local._4_4_ = 4;
    }
    memcpy(zBufOut,&sqlite3Config.iPrngSeed,(long)zBufOut_local._4_4_);
    pVfs_local._4_4_ = 0;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsRandomness(sqlite3_vfs *pVfs, int nByte, char *zBufOut){
  if( sqlite3Config.iPrngSeed ){
    memset(zBufOut, 0, nByte);
    if( ALWAYS(nByte>(signed)sizeof(unsigned)) ) nByte = sizeof(unsigned int);
    memcpy(zBufOut, &sqlite3Config.iPrngSeed, nByte);
    return SQLITE_OK;
  }else{
    return pVfs->xRandomness(pVfs, nByte, zBufOut);
  }

}